

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O1

void ImageColorTint(Image *image,Color color)

{
  int newFormat;
  Color *pCVar1;
  long lVar2;
  Image in_stack_00000000;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    pCVar1 = LoadImageColors(in_stack_00000000);
    if (0 < image->height * image->width) {
      lVar2 = 0;
      do {
        pCVar1[lVar2].r =
             (uchar)((ulong)((uint)pCVar1[lVar2].r * ((uint)color & 0xff)) * 0x1010102 >> 0x20);
        pCVar1[lVar2].g =
             (uchar)((ulong)((uint)pCVar1[lVar2].g * ((uint)color >> 8 & 0xff)) * 0x1010102 >> 0x20)
        ;
        pCVar1[lVar2].b =
             (uchar)((ulong)((uint)pCVar1[lVar2].b * ((uint)color >> 0x10 & 0xff)) * 0x1010102 >>
                    0x20);
        pCVar1[lVar2].a =
             (uchar)((ulong)((uint)pCVar1[lVar2].a * ((uint)color >> 0x18)) * 0x1010102 >> 0x20);
        lVar2 = lVar2 + 1;
      } while (lVar2 < (long)image->height * (long)image->width);
    }
    newFormat = image->format;
    free(image->data);
    image->data = pCVar1;
    image->format = 7;
    ImageFormat(image,newFormat);
    return;
  }
  return;
}

Assistant:

void ImageColorTint(Image *image, Color color)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    Color *pixels = LoadImageColors(*image);

    for (int i = 0; i < image->width*image->height; i++)
    {
        unsigned char r = (unsigned char)(((int)pixels[i].r*(int)color.r)/255);
        unsigned char g = (unsigned char)(((int)pixels[i].g*(int)color.g)/255);
        unsigned char b = (unsigned char)(((int)pixels[i].b*(int)color.b)/255);
        unsigned char a = (unsigned char)(((int)pixels[i].a*(int)color.a)/255);

        pixels[i].r = r;
        pixels[i].g = g;
        pixels[i].b = b;
        pixels[i].a = a;
    }

    int format = image->format;
    RL_FREE(image->data);

    image->data = pixels;
    image->format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;

    ImageFormat(image, format);
}